

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUVHandlePtr.cxx
# Opt level: O0

void __thiscall
cm::uv_handle_ptr_base_<uv_async_s>::allocate(uv_handle_ptr_base_<uv_async_s> *this,void *data)

{
  void *pvVar1;
  uv_async_s *__p;
  element_type *peVar2;
  uv_handle_deleter<uv_async_s> local_28;
  void *local_18;
  void *data_local;
  uv_handle_ptr_base_<uv_async_s> *this_local;
  
  local_18 = data;
  data_local = this;
  reset(this);
  __p = (uv_async_s *)calloc(1,0x80);
  uv_handle_deleter<uv_async_s>::uv_handle_deleter(&local_28);
  std::__shared_ptr<uv_async_s,(__gnu_cxx::_Lock_policy)2>::
  reset<uv_async_s,cm::uv_handle_deleter<uv_async_s>>
            ((__shared_ptr<uv_async_s,(__gnu_cxx::_Lock_policy)2> *)this,__p,&local_28);
  uv_handle_deleter<uv_async_s>::~uv_handle_deleter(&local_28);
  pvVar1 = local_18;
  peVar2 = std::__shared_ptr_access<uv_async_s,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<uv_async_s,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      this);
  peVar2->data = pvVar1;
  return;
}

Assistant:

void uv_handle_ptr_base_<T>::allocate(void* data)
{
  reset();

  /*
    We use calloc since we know all these types are c structs
    and we just want to 0 init them. New would do the same thing;
    but casting from uv_handle_t to certain other types -- namely
    uv_timer_t -- triggers a cast_align warning on certain systems.
  */
  handle.reset(static_cast<T*>(calloc(1, sizeof(T))), uv_handle_deleter<T>());
  handle->data = data;
}